

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_io.c
# Opt level: O3

int ARKStepSetTableNum(void *arkode_mem,ARKODE_DIRKTableID itable,ARKODE_ERKTableID etable)

{
  int iVar1;
  ARKodeButcherTable pAVar2;
  ARKodeButcherTable pAVar3;
  int line;
  char *pcVar4;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  sunindextype Bliw;
  sunindextype Blrw;
  ARKodeARKStepMem local_50;
  ARKodeMem local_48;
  long local_40;
  long local_38;
  
  iVar1 = arkStep_AccessARKODEStepMem(arkode_mem,"ARKStepSetTableNum",&local_48,&local_50);
  if (iVar1 != 0) {
    return iVar1;
  }
  local_50->stages = 0;
  local_50->q = 0;
  local_50->p = 0;
  ARKodeButcherTable_Space(local_50->Be,&local_40,&local_38);
  ARKodeButcherTable_Free(local_50->Be);
  local_50->Be = (ARKodeButcherTable)0x0;
  local_48->liw = local_48->liw - local_40;
  local_48->lrw = local_48->lrw - local_38;
  ARKodeButcherTable_Space(local_50->Bi,&local_40,&local_38);
  ARKodeButcherTable_Free(local_50->Bi);
  local_50->Bi = (ARKodeButcherTable)0x0;
  local_48->liw = local_48->liw - local_40;
  local_48->lrw = local_48->lrw - local_38;
  if ((etable & itable) < ARKODE_HEUN_EULER_2_1_2) {
    pcVar4 = "At least one valid table number must be supplied";
    iVar1 = 0x177;
  }
  else if (itable < ~ARKODE_DIRK_NONE) {
    if ((uint)etable < 0x1b) {
      pAVar2 = ARKodeButcherTable_LoadERK(etable);
      local_50->Be = pAVar2;
      if (pAVar2 != (ARKodeButcherTable)0x0) {
        local_50->stages = pAVar2->stages;
        iVar1 = pAVar2->p;
        local_50->q = pAVar2->q;
        local_50->p = iVar1;
        iVar1 = ARKStepSetExplicit(arkode_mem);
        if (iVar1 == 0) {
          return 0;
        }
        pcVar4 = "Error in ARKStepSetExplicit";
        line = 0x197;
        goto LAB_0011f171;
      }
      pcVar4 = "Error setting explicit table with that index";
      iVar1 = 0x18b;
    }
    else {
      pcVar4 = "Illegal ERK table number";
      iVar1 = 0x182;
    }
  }
  else if (etable < ARKODE_HEUN_EULER_2_1_2) {
    if ((uint)(itable + ~ARKODE_IMPLICIT_TRAPEZOIDAL_2_2) < 0xffffffe5) {
      pcVar4 = "Illegal IRK table number";
      iVar1 = 0x1a3;
    }
    else {
      pAVar2 = ARKodeButcherTable_LoadDIRK(itable);
      local_50->Bi = pAVar2;
      if (pAVar2 != (ARKodeButcherTable)0x0) {
        local_50->stages = pAVar2->stages;
        iVar1 = pAVar2->p;
        local_50->q = pAVar2->q;
        local_50->p = iVar1;
        iVar1 = ARKStepSetImplicit(arkode_mem);
        if (iVar1 == 0) {
          return 0;
        }
        pcVar4 = "Error in ARKStepSetImplicit";
        line = 0x1b8;
        goto LAB_0011f171;
      }
      pcVar4 = "Error setting table with that index";
      iVar1 = 0x1ac;
    }
  }
  else {
    if ((((itable != ARKODE_ARK324L2SA_DIRK_4_2_3 || etable != ARKODE_ARK324L2SA_ERK_4_2_3) &&
         (itable != ARKODE_ARK436L2SA_DIRK_6_3_4 || etable != ARKODE_ARK436L2SA_ERK_6_3_4)) &&
        (itable != ARKODE_ARK437L2SA_DIRK_7_3_4 || etable != ARKODE_ARK437L2SA_ERK_7_3_4)) &&
       (((itable != ARKODE_ARK548L2SA_DIRK_8_4_5 || etable != ARKODE_ARK548L2SA_ERK_8_4_5 &&
         (itable != ARKODE_ARK548L2SAb_DIRK_8_4_5 || etable != ARKODE_ARK548L2SAb_ERK_8_4_5)) &&
        (itable != ARKODE_ARK2_DIRK_3_1_2 || etable != ARKODE_ARK2_ERK_3_1_2)))) {
      pcVar4 = "Incompatible Butcher tables for ARK method";
      iVar1 = -0x16;
      line = 0x1ce;
LAB_0011f171:
      arkProcessError(local_48,-0x16,line,"ARKStepSetTableNum",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep_io.c"
                      ,pcVar4);
      return iVar1;
    }
    pAVar2 = ARKodeButcherTable_LoadDIRK(itable);
    local_50->Bi = pAVar2;
    pAVar3 = ARKodeButcherTable_LoadERK(etable);
    local_50->Be = pAVar3;
    pAVar2 = local_50->Bi;
    if (pAVar2 == (ARKodeButcherTable)0x0) {
      pcVar4 = "Illegal IRK table number";
      iVar1 = 0x1d8;
    }
    else {
      if (pAVar3 != (ARKodeButcherTable)0x0) {
        local_50->stages = pAVar2->stages;
        iVar1 = pAVar2->p;
        local_50->q = pAVar2->q;
        local_50->p = iVar1;
        iVar1 = ARKStepSetImEx(arkode_mem);
        if (iVar1 == 0) {
          return 0;
        }
        pcVar4 = 
        "Cannot specify that method is ImEx without providing function pointers to fi(t,y) and fe(t,y)."
        ;
        iVar1 = -0x16;
        line = 0x1e9;
        goto LAB_0011f171;
      }
      pcVar4 = "Illegal ERK table number";
      iVar1 = 0x1de;
    }
  }
  arkProcessError(local_48,-0x15,iVar1,"ARKStepSetTableNum",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep_io.c"
                  ,pcVar4);
  return -0x16;
}

Assistant:

int ARKStepSetTableNum(void* arkode_mem, ARKODE_DIRKTableID itable,
                       ARKODE_ERKTableID etable)
{
  int flag, retval;
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  sunindextype Blrw, Bliw;

  /* access ARKodeMem and ARKodeARKStepMem structures */
  retval = arkStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* clear any existing parameters and Butcher tables */
  step_mem->stages = 0;
  step_mem->q      = 0;
  step_mem->p      = 0;

  ARKodeButcherTable_Space(step_mem->Be, &Bliw, &Blrw);
  ARKodeButcherTable_Free(step_mem->Be);
  step_mem->Be = NULL;
  ark_mem->liw -= Bliw;
  ark_mem->lrw -= Blrw;

  ARKodeButcherTable_Space(step_mem->Bi, &Bliw, &Blrw);
  ARKodeButcherTable_Free(step_mem->Bi);
  step_mem->Bi = NULL;
  ark_mem->liw -= Bliw;
  ark_mem->lrw -= Blrw;

  /* determine mode (implicit/explicit/ImEx), and perform
     appropriate actions  */

  /*     illegal inputs */
  if ((itable < 0) && (etable < 0))
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    "At least one valid table number must be supplied");
    return (ARK_ILL_INPUT);

    /* explicit */
  }
  else if (itable < 0)
  {
    /* check that argument specifies an explicit table */
    if (etable < ARKODE_MIN_ERK_NUM || etable > ARKODE_MAX_ERK_NUM)
    {
      arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                      "Illegal ERK table number");
      return (ARK_ILL_INPUT);
    }

    /* fill in table based on argument */
    step_mem->Be = ARKodeButcherTable_LoadERK(etable);
    if (step_mem->Be == NULL)
    {
      arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                      "Error setting explicit table with that index");
      return (ARK_ILL_INPUT);
    }
    step_mem->stages = step_mem->Be->stages;
    step_mem->q      = step_mem->Be->q;
    step_mem->p      = step_mem->Be->p;

    /* set method as purely explicit */
    flag = ARKStepSetExplicit(arkode_mem);
    if (flag != ARK_SUCCESS)
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      "Error in ARKStepSetExplicit");
      return (flag);
    }

    /* implicit */
  }
  else if (etable < 0)
  {
    /* check that argument specifies an implicit table */
    if (itable < ARKODE_MIN_DIRK_NUM || itable > ARKODE_MAX_DIRK_NUM)
    {
      arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                      "Illegal IRK table number");
      return (ARK_ILL_INPUT);
    }

    /* fill in table based on argument */
    step_mem->Bi = ARKodeButcherTable_LoadDIRK(itable);
    if (step_mem->Bi == NULL)
    {
      arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                      "Error setting table with that index");
      return (ARK_ILL_INPUT);
    }
    step_mem->stages = step_mem->Bi->stages;
    step_mem->q      = step_mem->Bi->q;
    step_mem->p      = step_mem->Bi->p;

    /* set method as purely implicit */
    flag = ARKStepSetImplicit(arkode_mem);
    if (flag != ARK_SUCCESS)
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      "Error in ARKStepSetImplicit");
      return (flag);
    }

    /* ImEx */
  }
  else
  {
    /* ensure that tables match */
    if (!((etable == ARKODE_ARK324L2SA_ERK_4_2_3) &&
          (itable == ARKODE_ARK324L2SA_DIRK_4_2_3)) &&
        !((etable == ARKODE_ARK436L2SA_ERK_6_3_4) &&
          (itable == ARKODE_ARK436L2SA_DIRK_6_3_4)) &&
        !((etable == ARKODE_ARK437L2SA_ERK_7_3_4) &&
          (itable == ARKODE_ARK437L2SA_DIRK_7_3_4)) &&
        !((etable == ARKODE_ARK548L2SA_ERK_8_4_5) &&
          (itable == ARKODE_ARK548L2SA_DIRK_8_4_5)) &&
        !((etable == ARKODE_ARK548L2SAb_ERK_8_4_5) &&
          (itable == ARKODE_ARK548L2SAb_DIRK_8_4_5)) &&
        !((etable == ARKODE_ARK2_ERK_3_1_2) && (itable == ARKODE_ARK2_DIRK_3_1_2)))
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      "Incompatible Butcher tables for ARK method");
      return (ARK_ILL_INPUT);
    }

    /* fill in tables based on arguments */
    step_mem->Bi = ARKodeButcherTable_LoadDIRK(itable);
    step_mem->Be = ARKodeButcherTable_LoadERK(etable);
    if (step_mem->Bi == NULL)
    {
      arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                      "Illegal IRK table number");
      return (ARK_ILL_INPUT);
    }
    if (step_mem->Be == NULL)
    {
      arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                      "Illegal ERK table number");
      return (ARK_ILL_INPUT);
    }
    step_mem->stages = step_mem->Bi->stages;
    step_mem->q      = step_mem->Bi->q;
    step_mem->p      = step_mem->Bi->p;

    /* set method as ImEx */
    if (ARKStepSetImEx(arkode_mem) != ARK_SUCCESS)
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_ARK_MISSING_F);
      return (ARK_ILL_INPUT);
    }
  }

  return (ARK_SUCCESS);
}